

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  tuple<double,_int,_long> tStack_58;
  tuple<double,_int,_long> local_40;
  
  plVar3 = this->first_;
  if ((char *)*plVar3 == __to) {
    if (__to != (char *)0xffffffffffffffff) {
      HighsNodeQueue::NodeHybridEstimRbTree::getKey
                (&local_40,(NodeHybridEstimRbTree *)this,(int64_t)__from);
      HighsNodeQueue::NodeHybridEstimRbTree::getKey
                (&tStack_58,(NodeHybridEstimRbTree *)this,(int64_t)__to);
      bVar1 = std::
              __tuple_compare<std::tuple<double,_int,_long>,_std::tuple<double,_int,_long>,_0UL,_3UL>
              ::__less(&local_40,&tStack_58);
      if (!bVar1) goto LAB_002d38e9;
      plVar3 = this->first_;
    }
    *plVar3 = (long)__from;
  }
LAB_002d38e9:
  iVar2 = RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>,__from,__to);
  return iVar2;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }